

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
* __thiscall
flow::lang::ParamList::at_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
           *__return_storage_ptr__,ParamList *this,size_t offset)

{
  __uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> _Var1;
  allocator<char> local_41;
  string local_40 [32];
  
  if (this->isNamed_ == true) {
    std::__cxx11::string::string
              (local_40,(string *)
                        ((this->names_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + offset));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  }
  _Var1._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
  super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
       (this->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[offset]._M_t.
       super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t;
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  __return_storage_ptr__->second =
       (Expr *)_Var1._M_t.
               super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
               super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, Expr*> ParamList::at(size_t offset) const {
  return std::make_pair(isNamed() ? names_[offset] : "", values_[offset].get());
}